

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O3

void anon_unknown.dwarf_159e1e::upload_attribute
               (GLuint VAO,GLint dimension,GLint *data,int num_vertices,GLint location)

{
  undefined8 in_RAX;
  undefined4 in_register_0000003c;
  GLuint VBO;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (location < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "WARNING: Not uploading attribute with a negative location. The vertex shader doesn\'t declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n"
               ,0xc5);
    return;
  }
  if (0 < num_vertices) {
    if (data != (GLint *)0x0) {
      (*gl3wProcs.ptr[0x1a])(CONCAT44(in_register_0000003c,VAO));
      (*gl3wProcs.ptr[0xab])(1,&local_34);
      (*gl3wProcs.ptr[8])(0x8892,(ulong)local_34);
      (*gl3wProcs.ptr[0x28])
                (0x8892,(ulong)(uint)num_vertices * (ulong)(uint)dimension * 4,data,0x88e4);
      (*gl3wProcs.ptr[0x277])(location,(ulong)(uint)dimension,0x1404,0,0);
      (*gl3wProcs.ptr[0x98])(location);
      (*gl3wProcs.ptr[0x1a])(0);
      (*gl3wProcs.ptr[8])(0x8892,0);
      (*gl3wProcs.ptr[0x6a])(1,&local_34);
      return;
    }
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                  ,0x3d,
                  "void (anonymous namespace)::upload_attribute(GLuint, GLint, const GLint *, int, GLint)"
                 );
  }
  __assert_fail("num_vertices > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                ,0x3c,
                "void (anonymous namespace)::upload_attribute(GLuint, GLint, const GLint *, int, GLint)"
               );
}

Assistant:

void upload_attribute( GLuint VAO, GLint dimension, const GLint* data, int num_vertices, GLint location )
{
    if( location < 0 ) {
        std::cerr << "WARNING: Not uploading attribute with a negative location. The vertex shader doesn't declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n";
        return;
    }
    
    assert( num_vertices > 0 );
    assert( data );
    
    // Bind the Vertex Array Object
	glBindVertexArray( VAO );
	
    // Generate a GPU buffer
	GLuint VBO;
	glGenBuffers( 1, &VBO );
	
	// Bind the buffer
	glBindBuffer( GL_ARRAY_BUFFER, VBO );
	// Upload the data
    glBufferData(
        GL_ARRAY_BUFFER,
        sizeof(GLint)*dimension*num_vertices,
        data,
        GL_STATIC_DRAW
        );
	
	// Attach the data to the given attribute ID
	glVertexAttribIPointer( location, dimension, GL_INT, 0, 0 );
    glEnableVertexAttribArray( location );
    
    // Unbind so we can delete the attribute buffer.
    glBindVertexArray( 0 );
    glBindBuffer( GL_ARRAY_BUFFER, 0 );
    // Delete the attribute buffer. This won't actually delete it until we delete the VAO.
    glDeleteBuffers( 1, &VBO );
}